

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000017f640 = 0x2d2d2d2d2d2d2d;
    uRam000000000017f647 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0017f630 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000017f638 = 0x2d2d2d2d2d2d2d;
    DAT_0017f63f = 0x2d;
    _DAT_0017f620 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000017f628 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0017f610 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000017f618 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam000000000017f608 = 0x2d2d2d2d2d2d2d2d;
    DAT_0017f64f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }